

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign
          (CImg<unsigned_int> *this,uint *values,uint size_x,uint size_y,uint size_z,uint size_c,
          bool is_shared)

{
  bool bVar1;
  uint *puVar2;
  long lVar3;
  
  lVar3 = (ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x;
  bVar1 = this->_is_shared;
  if (values == (uint *)0x0 || lVar3 == 0) {
    if ((bVar1 == false) && (this->_data != (uint *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (uint *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
    return this;
  }
  if (is_shared) {
    if (bVar1 == false) {
      puVar2 = this->_data;
      if ((values + lVar3 < puVar2) ||
         (puVar2 + (ulong)this->_depth * (ulong)this->_spectrum *
                   (ulong)this->_height * (ulong)this->_width <= values)) {
        if (puVar2 != (uint *)0x0) {
          operator_delete__(puVar2);
        }
        this->_data = (uint *)0x0;
        this->_width = 0;
        this->_height = 0;
        this->_depth = 0;
        this->_spectrum = 0;
        this->_is_shared = false;
      }
      else {
        cimg::warn(
                  "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign(): Shared image instance has overlapping memory."
                  );
      }
    }
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    this->_is_shared = true;
    this->_data = values;
    return this;
  }
  if (bVar1 != false) {
    this->_data = (uint *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  assign(this,values,size_x,size_y,size_z,size_c);
  return this;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y,
                    const unsigned int size_z, const unsigned int size_c, const bool is_shared) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      if (!is_shared) { if (_is_shared) assign(); assign(values,size_x,size_y,size_z,size_c); }
      else {
	if (!_is_shared) {
	  if (values + siz<_data || values>=_data + size()) assign();
	  else cimg::warn(_cimg_instance
                          "assign(): Shared image instance has overlapping memory.",
                          cimg_instance);
	}
	_width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c; _is_shared = true;
	_data = const_cast<T*>(values);
      }
      return *this;
    }